

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_rconf.c
# Opt level: O1

mk_rconf_section * mk_rconf_section_get(mk_rconf *conf,char *name)

{
  mk_list *pmVar1;
  int iVar2;
  
  pmVar1 = (conf->sections).next;
  while( true ) {
    if (pmVar1 == &conf->sections) {
      return (mk_rconf_section *)0x0;
    }
    iVar2 = strcasecmp((char *)pmVar1[-2].next,name);
    if (iVar2 == 0) break;
    pmVar1 = pmVar1->next;
  }
  return (mk_rconf_section *)&pmVar1[-2].next;
}

Assistant:

struct mk_rconf_section *mk_rconf_section_get(struct mk_rconf *conf,
                                              const char *name)
{
    struct mk_list *head;
    struct mk_rconf_section *section;

    mk_list_foreach(head, &conf->sections) {
        section = mk_list_entry(head, struct mk_rconf_section, _head);
        if (strcasecmp(section->name, name) == 0) {
            return section;
        }
    }

    return NULL;
}